

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O1

int run_test_tcp_create_early_bad_domain(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  char *handle;
  uv_tcp_t client;
  sockaddr_in sStack_370;
  uv_tcp_t uStack_360;
  undefined1 auStack_268 [344];
  code *pcStack_110;
  uv_tcp_t local_100;
  
  pcStack_110 = (code *)0x16fedf;
  puVar2 = uv_default_loop();
  pcStack_110 = (code *)0x16fef1;
  iVar1 = uv_tcp_init_ex(puVar2,&local_100,0x2f);
  if (iVar1 == -0x16) {
    pcStack_110 = (code *)0x16fefb;
    puVar2 = uv_default_loop();
    pcStack_110 = (code *)0x16ff0d;
    iVar1 = uv_tcp_init_ex(puVar2,&local_100,0x400);
    if (iVar1 != -0x16) goto LAB_0016ff65;
    pcStack_110 = (code *)0x16ff17;
    puVar2 = uv_default_loop();
    pcStack_110 = (code *)0x16ff21;
    uv_run(puVar2,UV_RUN_DEFAULT);
    pcStack_110 = (code *)0x16ff26;
    unaff_RBX = uv_default_loop();
    pcStack_110 = (code *)0x16ff3a;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_110 = (code *)0x16ff44;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_110 = (code *)0x16ff49;
    puVar2 = uv_default_loop();
    pcStack_110 = (code *)0x16ff51;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_110 = (code *)0x16ff65;
    run_test_tcp_create_early_bad_domain_cold_1();
LAB_0016ff65:
    pcStack_110 = (code *)0x16ff6a;
    run_test_tcp_create_early_bad_domain_cold_2();
  }
  pcStack_110 = run_test_tcp_create_early_accept;
  run_test_tcp_create_early_bad_domain_cold_3();
  pcStack_110 = (code *)unaff_RBX;
  puVar2 = uv_default_loop();
  handle = "0.0.0.0";
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&uStack_360);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(puVar2,(uv_tcp_t *)auStack_268);
    handle = (char *)puVar2;
    if (iVar1 != 0) goto LAB_0017009e;
    handle = auStack_268;
    iVar1 = uv_tcp_bind((uv_tcp_t *)handle,(sockaddr *)&uStack_360,0);
    if (iVar1 != 0) goto LAB_001700a3;
    handle = auStack_268;
    iVar1 = uv_listen((uv_stream_t *)handle,0x80,on_connection);
    if (iVar1 != 0) goto LAB_001700a8;
    puVar2 = uv_default_loop();
    handle = "127.0.0.1";
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_370);
    if (iVar1 != 0) goto LAB_001700ad;
    iVar1 = uv_tcp_init(puVar2,&uStack_360);
    if (iVar1 != 0) goto LAB_001700b2;
    puVar2 = (uv_loop_t *)(auStack_268 + 0xf8);
    iVar1 = uv_tcp_connect((uv_connect_t *)puVar2,&uStack_360,(sockaddr *)&sStack_370,on_connect);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001700bc;
    }
  }
  else {
    run_test_tcp_create_early_accept_cold_1();
LAB_0017009e:
    run_test_tcp_create_early_accept_cold_2();
LAB_001700a3:
    run_test_tcp_create_early_accept_cold_3();
LAB_001700a8:
    run_test_tcp_create_early_accept_cold_4();
LAB_001700ad:
    puVar2 = (uv_loop_t *)handle;
    run_test_tcp_create_early_accept_cold_5();
LAB_001700b2:
    run_test_tcp_create_early_accept_cold_6();
  }
  run_test_tcp_create_early_accept_cold_7();
LAB_001700bc:
  run_test_tcp_create_early_accept_cold_8();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_create_early_bad_domain) {
  uv_tcp_t client;
  int r;

  r = uv_tcp_init_ex(uv_default_loop(), &client, 47);
  ASSERT(r == UV_EINVAL);

  r = uv_tcp_init_ex(uv_default_loop(), &client, 1024);
  ASSERT(r == UV_EINVAL);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}